

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O0

bool __thiscall
tinyusdz::tydra::RenderSceneConverter::ConvertSkelAnimation
          (RenderSceneConverter *this,RenderSceneConverterEnv *env,Path *abs_path,
          SkelAnimation *skelAnim,Animation *anim_out)

{
  Stage *pSVar1;
  AnimationSample<float> AVar2;
  undefined8 uVar3;
  bool bVar4;
  size_type sVar5;
  reference this_00;
  ostream *poVar6;
  TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
  *this_01;
  vector<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
  *pvVar7;
  reference in;
  const_reference pvVar8;
  TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
  *this_02;
  vector<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
  *this_03;
  reference in_00;
  const_reference pvVar9;
  reference pvVar10;
  TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
  *this_04;
  vector<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample>_>
  *this_05;
  reference in_01;
  const_reference pvVar11;
  const_reference pvVar12;
  reference pvVar13;
  iterator iVar14;
  iterator iVar15;
  back_insert_iterator<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
  bVar16;
  reference value;
  iterator iVar17;
  iterator iVar18;
  back_insert_iterator<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
  bVar19;
  mapped_type *pmVar20;
  mapped_type *pmVar21;
  reference pvVar22;
  TypedTimeSamples<std::vector<float,_std::allocator<float>_>_> *this_06;
  vector<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
  *this_07;
  reference in_02;
  AnimationSample<float> AVar23;
  const_reference pvVar24;
  size_type sVar25;
  reference value_00;
  reference pvVar26;
  string *psVar27;
  mapped_type *pmVar28;
  PrimMeta *pPVar29;
  Path *in_R9;
  float fVar30;
  Path *in_stack_ffffffffffffced8;
  ulong uVar31;
  value_type_conflict local_3028;
  string local_3008;
  string local_2fe8;
  allocator local_2fc1;
  string local_2fc0;
  string local_2fa0;
  ostringstream local_2f80 [8];
  ostringstream ss_e_21;
  optional<float> local_2e08;
  ulong local_2e00;
  size_t i;
  size_type local_2dd8;
  undefined1 local_2dd0 [16];
  string local_2dc0 [32];
  string local_2da0;
  ostringstream local_2d80 [8];
  ostringstream ss_e_20;
  string local_2c08;
  allocator local_2be1;
  string local_2be0;
  string local_2bc0;
  ostringstream local_2ba0 [8];
  ostringstream ss_e_19;
  undefined1 local_2a28 [8];
  vector<float,_std::allocator<float>_> ws;
  string *targetName;
  AnimationSample<float> s_3;
  size_t j_6;
  size_type local_29d8;
  double local_29d0;
  allocator local_29c1;
  string local_29c0 [32];
  string local_29a0;
  ostringstream local_2980 [8];
  ostringstream ss_e_18;
  Sample *sample_3;
  const_iterator __end5;
  const_iterator __begin5;
  vector<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
  *__range5;
  TypedTimeSamples<std::vector<float,_std::allocator<float>_>_> *ts_weights;
  allocator local_27b9;
  string local_27b8;
  string local_2798;
  ostringstream local_2778 [8];
  ostringstream ss_e_17;
  undefined1 local_2600 [8];
  Animatable<std::vector<float,_std::allocator<float>_>_> weights;
  optional<float> local_25b8;
  Token *local_25b0;
  Token *bs;
  iterator __end4_3;
  iterator __begin4_3;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *__range4_3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
  weightsMap;
  mapped_type *it_5;
  string jointName_5;
  size_t j_5;
  string local_2500;
  size_type local_24e0;
  undefined1 local_24d8 [16];
  string local_24c8 [32];
  string local_24a8;
  ostringstream local_2488 [8];
  ostringstream ss_e_16;
  string local_2310;
  allocator local_22e9;
  string local_22e8;
  string local_22c8;
  ostringstream local_22a8 [8];
  ostringstream ss_e_15;
  undefined1 local_2130 [8];
  vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
  _scale;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> scale;
  mapped_type *it_4;
  string jointName_4;
  size_t j_4;
  string local_20a0;
  size_type local_2080;
  undefined1 local_2078 [16];
  string local_2068 [32];
  string local_2048;
  ostringstream local_2028 [8];
  ostringstream ss_e_14;
  string local_1eb0;
  allocator local_1e89;
  string local_1e88;
  string local_1e68;
  ostringstream local_1e48 [8];
  ostringstream ss_e_13;
  undefined1 local_1cd0 [8];
  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> _rotation;
  vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> rotation;
  mapped_type *it_3;
  string jointName_3;
  size_t j_3;
  size_type local_1c48;
  undefined1 local_1c40 [16];
  string local_1c30 [32];
  string local_1c10;
  ostringstream local_1bf0 [8];
  ostringstream ss_e_12;
  string local_1a78;
  allocator local_1a51;
  string local_1a50;
  string local_1a30;
  ostringstream local_1a10 [8];
  ostringstream ss_e_11;
  undefined1 local_1898 [8];
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> translation;
  mapped_type *it_2;
  string jointName_2;
  undefined1 local_1848 [8];
  AnimationSample<std::array<float,_3UL>_> s_2;
  size_t j_2;
  size_type local_1810;
  double local_1808;
  allocator local_17f9;
  string local_17f8 [32];
  string local_17d8;
  ostringstream local_17b8 [8];
  ostringstream ss_e_10;
  Sample *sample_2;
  const_iterator __end4_2;
  const_iterator __begin4_2;
  vector<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample>_>
  *__range4_2;
  TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
  *ts_scales;
  mapped_type *local_1610;
  mapped_type *it_1;
  string jointName_1;
  undefined1 auStack_15e0 [4];
  AnimationSample<std::array<float,_4UL>_> s_1;
  size_t j_1;
  size_type local_15a8;
  double local_15a0;
  allocator local_1591;
  string local_1590 [32];
  string local_1570;
  ostringstream local_1550 [8];
  ostringstream ss_e_9;
  Sample *sample_1;
  const_iterator __end4_1;
  const_iterator __begin4_1;
  vector<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
  *__range4_1;
  TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
  *ts_rots;
  mapped_type *local_13a8;
  mapped_type *it;
  string jointName;
  AnimationSample<std::array<float,_3UL>_> s;
  size_t j;
  size_type local_1348;
  double local_1340;
  allocator local_1331;
  string local_1330 [32];
  string local_1310;
  ostringstream local_12f0 [8];
  ostringstream ss_e_8;
  Sample *sample;
  const_iterator __end4;
  const_iterator __begin4;
  vector<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
  *__range4;
  allocator local_1131;
  string local_1130;
  string local_1110;
  ostringstream local_10f0 [8];
  ostringstream ss_e_7;
  TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
  *ts_txs;
  allocator local_f49;
  string local_f48;
  string local_f28;
  ostringstream local_f08 [8];
  ostringstream ss_e_6;
  undefined1 local_d90 [8];
  Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
  scales;
  allocator local_d29;
  string local_d28;
  string local_d08;
  ostringstream local_ce8 [8];
  ostringstream ss_e_5;
  undefined1 local_b70 [8];
  Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
  rotations;
  allocator local_b09;
  string local_b08;
  string local_ae8;
  ostringstream local_ac8 [8];
  ostringstream ss_e_4;
  undefined1 local_950 [8];
  Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
  translations;
  uint64_t id;
  Token *joint;
  iterator __end3;
  iterator __begin3;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *__range3;
  StringAndIdMap jointIdMap;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
  channelMap;
  allocator local_831;
  string local_830;
  string local_810;
  ostringstream local_7f0 [8];
  ostringstream ss_e_3;
  string local_678;
  allocator local_651;
  string local_650;
  string local_630;
  ostringstream local_610 [8];
  ostringstream ss_e_2;
  allocator local_491;
  string local_490;
  undefined1 local_470 [8];
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> blendShapes;
  char *local_438;
  char *local_430;
  char *local_428;
  allocator local_419;
  string local_418 [32];
  string local_3f8;
  ostringstream local_3d8 [8];
  ostringstream ss_e_1;
  string local_258;
  allocator local_231;
  string local_230;
  string local_210;
  ostringstream local_1f0 [8];
  ostringstream ss_e;
  allocator local_71;
  string local_70;
  undefined1 local_50 [8];
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> joints;
  Animation *anim_out_local;
  SkelAnimation *skelAnim_local;
  Path *abs_path_local;
  RenderSceneConverterEnv *env_local;
  RenderSceneConverter *this_local;
  
  joints.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)anim_out;
  ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::vector
            ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_50);
  bVar4 = TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::authored
                    (&skelAnim->joints);
  if (bVar4) {
    pSVar1 = env->stage;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_70,"joints",&local_71);
    bVar4 = EvaluateTypedAttribute<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                      (pSVar1,&skelAnim->joints,&local_70,
                       (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_50,
                       &this->_err);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_71);
    if (((bVar4 ^ 0xffU) & 1) != 0) {
      ::std::__cxx11::ostringstream::ostringstream(local_1f0);
      poVar6 = ::std::operator<<((ostream *)local_1f0,"[error]");
      poVar6 = ::std::operator<<(poVar6,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                );
      poVar6 = ::std::operator<<(poVar6,":");
      poVar6 = ::std::operator<<(poVar6,"ConvertSkelAnimation");
      poVar6 = ::std::operator<<(poVar6,"():");
      poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x1528);
      ::std::operator<<(poVar6," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_230,"Failed to evaluate `joints` in SkelAnimation Prim : {}",
                 &local_231);
      fmt::format<tinyusdz::Path>(&local_210,&local_230,abs_path);
      poVar6 = ::std::operator<<((ostream *)local_1f0,(string *)&local_210);
      ::std::operator<<(poVar6,"\n");
      ::std::__cxx11::string::~string((string *)&local_210);
      ::std::__cxx11::string::~string((string *)&local_230);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_231);
      ::std::__cxx11::ostringstream::str();
      PushError(this,&local_258);
      ::std::__cxx11::string::~string((string *)&local_258);
      this_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_1f0);
      goto LAB_004c94e8;
    }
    bVar4 = TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
            ::authored(&skelAnim->rotations);
    if (((!bVar4) ||
        (bVar4 = TypedAttribute<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
                 ::authored(&skelAnim->translations), !bVar4)) ||
       (bVar4 = TypedAttribute<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
                ::authored(&skelAnim->scales), !bVar4)) {
      ::std::__cxx11::ostringstream::ostringstream(local_3d8);
      poVar6 = ::std::operator<<((ostream *)local_3d8,"[error]");
      poVar6 = ::std::operator<<(poVar6,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                );
      poVar6 = ::std::operator<<(poVar6,":");
      poVar6 = ::std::operator<<(poVar6,"ConvertSkelAnimation");
      poVar6 = ::std::operator<<(poVar6,"():");
      poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x1531);
      ::std::operator<<(poVar6," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_418,
                 "`translations`, `rotations` and `scales` must be all authored for SkelAnimation Prim {}. authored flags: translations {}, rotations {}, scales {}"
                 ,&local_419);
      bVar4 = TypedAttribute<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
              ::authored(&skelAnim->translations);
      local_428 = "no";
      if (bVar4) {
        local_428 = "yes";
      }
      bVar4 = TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
              ::authored(&skelAnim->rotations);
      local_430 = "no";
      if (bVar4) {
        local_430 = "yes";
      }
      bVar4 = TypedAttribute<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
              ::authored(&skelAnim->scales);
      local_438 = "no";
      if (bVar4) {
        local_438 = "yes";
      }
      fmt::format<tinyusdz::Path,char_const*,char_const*,char_const*>
                (&local_3f8,(fmt *)local_418,&abs_path->_prim_part,(Path *)&local_428,&local_430,
                 &local_438,(char **)in_stack_ffffffffffffced8);
      poVar6 = ::std::operator<<((ostream *)local_3d8,(string *)&local_3f8);
      ::std::operator<<(poVar6,"\n");
      ::std::__cxx11::string::~string((string *)&local_3f8);
      ::std::__cxx11::string::~string(local_418);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_419);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &blendShapes.
                      super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &blendShapes.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_3d8);
      goto LAB_004c94e8;
    }
  }
  ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::vector
            ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_470);
  bVar4 = TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::authored
                    (&skelAnim->blendShapes);
  if (bVar4) {
    pSVar1 = env->stage;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_490,"blendShapes",&local_491);
    bVar4 = EvaluateTypedAttribute<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                      (pSVar1,&skelAnim->blendShapes,&local_490,
                       (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_470,
                       &this->_err);
    ::std::__cxx11::string::~string((string *)&local_490);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_491);
    if (((bVar4 ^ 0xffU) & 1) == 0) {
      bVar4 = TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_>::
              authored(&skelAnim->blendShapeWeights);
      if (bVar4) goto LAB_004c66e8;
      ::std::__cxx11::ostringstream::ostringstream(local_7f0);
      poVar6 = ::std::operator<<((ostream *)local_7f0,"[error]");
      poVar6 = ::std::operator<<(poVar6,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                );
      poVar6 = ::std::operator<<(poVar6,":");
      poVar6 = ::std::operator<<(poVar6,"ConvertSkelAnimation");
      poVar6 = ::std::operator<<(poVar6,"():");
      poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x153d);
      ::std::operator<<(poVar6," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_830,
                 "`blendShapeWeights` must be authored for SkelAnimation Prim {}",&local_831);
      fmt::format<tinyusdz::Path>(&local_810,&local_830,abs_path);
      poVar6 = ::std::operator<<((ostream *)local_7f0,(string *)&local_810);
      ::std::operator<<(poVar6,"\n");
      ::std::__cxx11::string::~string((string *)&local_810);
      ::std::__cxx11::string::~string((string *)&local_830);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_831);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)&channelMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
      ::std::__cxx11::string::~string
                ((string *)&channelMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
      this_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_7f0);
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_610);
      poVar6 = ::std::operator<<((ostream *)local_610,"[error]");
      poVar6 = ::std::operator<<(poVar6,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                );
      poVar6 = ::std::operator<<(poVar6,":");
      poVar6 = ::std::operator<<(poVar6,"ConvertSkelAnimation");
      poVar6 = ::std::operator<<(poVar6,"():");
      poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x1539);
      ::std::operator<<(poVar6," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_650,"Failed to evaluate `blendShapes` in SkelAnimation Prim : {}",
                 &local_651);
      fmt::format<tinyusdz::Path>(&local_630,&local_650,abs_path);
      poVar6 = ::std::operator<<((ostream *)local_610,(string *)&local_630);
      ::std::operator<<(poVar6,"\n");
      ::std::__cxx11::string::~string((string *)&local_630);
      ::std::__cxx11::string::~string((string *)&local_650);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_651);
      ::std::__cxx11::ostringstream::str();
      PushError(this,&local_678);
      ::std::__cxx11::string::~string((string *)&local_678);
      this_local._7_1_ = 0;
      ::std::__cxx11::ostringstream::~ostringstream(local_610);
    }
  }
  else {
LAB_004c66e8:
    ::std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
           *)&jointIdMap._s_to_i._M_t._M_impl.super__Rb_tree_header._M_node_count);
    sVar5 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                      ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_50);
    if (sVar5 == 0) {
LAB_004c887a:
      sVar5 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                        ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_470);
      if (sVar5 != 0) {
        ::std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
               *)&__range4_3);
        bVar4 = TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_>::
                is_value_empty(&skelAnim->blendShapeWeights);
        if (bVar4) {
          __end4_3._M_current =
               (Token *)std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::begin
                                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                   local_470);
          bs = (Token *)std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::end
                                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                   local_470);
          while (bVar4 = __gnu_cxx::operator!=
                                   (&__end4_3,
                                    (__normal_iterator<tinyusdz::Token_*,_std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                                     *)&bs), bVar4) {
            local_25b0 = __gnu_cxx::
                         __normal_iterator<tinyusdz::Token_*,_std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                         ::operator*(&__end4_3);
            weights._ts._28_4_ = 0x3f800000;
            nonstd::optional_lite::optional<float>::optional<float,_0>
                      (&local_25b8,(float *)&weights._ts.field_0x1c);
            psVar27 = Token::str_abi_cxx11_(local_25b0);
            pmVar28 = ::std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
                                    *)&__range4_3,psVar27);
            nonstd::optional_lite::optional<float>::operator=(&pmVar28->static_value,&local_25b8);
            nonstd::optional_lite::optional<float>::~optional(&local_25b8);
            __gnu_cxx::
            __normal_iterator<tinyusdz::Token_*,_std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
            ::operator++(&__end4_3);
          }
LAB_004c93ec:
          ::std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
          ::operator=((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
                       *)&joints.
                          super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage[4].str_.field_2,
                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
                       *)&__range4_3);
          bVar4 = false;
        }
        else {
          Animatable<std::vector<float,_std::allocator<float>_>_>::Animatable
                    ((Animatable<std::vector<float,_std::allocator<float>_>_> *)local_2600);
          bVar4 = TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_>
                  ::get_value(&skelAnim->blendShapeWeights,
                              (Animatable<std::vector<float,_std::allocator<float>_>_> *)local_2600)
          ;
          if (bVar4) {
            bVar4 = Animatable<std::vector<float,_std::allocator<float>_>_>::has_timesamples
                              ((Animatable<std::vector<float,_std::allocator<float>_>_> *)local_2600
                              );
            if (bVar4) {
              this_06 = Animatable<std::vector<float,_std::allocator<float>_>_>::get_timesamples
                                  ((Animatable<std::vector<float,_std::allocator<float>_>_> *)
                                   local_2600);
              this_07 = TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::get_samples
                                  (this_06);
              __end5 = ::std::
                       vector<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
                       ::begin(this_07);
              sample_3 = (Sample *)
                         ::std::
                         vector<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
                         ::end(this_07);
              while (bVar4 = __gnu_cxx::operator!=
                                       (&__end5,(__normal_iterator<const_tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample_*,_std::vector<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>_>
                                                 *)&sample_3), bVar4) {
                in_02 = __gnu_cxx::
                        __normal_iterator<const_tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample_*,_std::vector<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>_>
                        ::operator*(&__end5);
                if ((in_02->blocked & 1U) == 0) {
                  sVar5 = ::std::vector<float,_std::allocator<float>_>::size(&in_02->value);
                  sVar25 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                                     ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                      local_470);
                  if (sVar5 != sVar25) {
                    ::std::__cxx11::ostringstream::ostringstream(local_2980);
                    poVar6 = ::std::operator<<((ostream *)local_2980,"[error]");
                    poVar6 = ::std::operator<<(poVar6,
                                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                              );
                    poVar6 = ::std::operator<<(poVar6,":");
                    poVar6 = ::std::operator<<(poVar6,"ConvertSkelAnimation");
                    poVar6 = ::std::operator<<(poVar6,"():");
                    poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x1659);
                    ::std::operator<<(poVar6," ");
                    ::std::allocator<char>::allocator();
                    ::std::__cxx11::string::string
                              (local_29c0,
                               "Array length mismatch in SkelAnimation. timeCode {} blendShapeWeights.size {} must be equal to blendShapes.size {} : {}"
                               ,&local_29c1);
                    local_29d0 = (double)::std::vector<float,_std::allocator<float>_>::size
                                                   (&in_02->value);
                    local_29d8 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::
                                 size((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                      local_470);
                    fmt::format<double,unsigned_long,unsigned_long,tinyusdz::Path>
                              (&local_29a0,(fmt *)local_29c0,(string *)in_02,&local_29d0,&local_29d8
                               ,(unsigned_long *)abs_path,in_stack_ffffffffffffced8);
                    poVar6 = ::std::operator<<((ostream *)local_2980,(string *)&local_29a0);
                    ::std::operator<<(poVar6,"\n");
                    ::std::__cxx11::string::~string((string *)&local_29a0);
                    ::std::__cxx11::string::~string(local_29c0);
                    ::std::allocator<char>::~allocator((allocator<char> *)&local_29c1);
                    ::std::__cxx11::ostringstream::str();
                    PushError(this,(string *)&j_6);
                    ::std::__cxx11::string::~string((string *)&j_6);
                    this_local._7_1_ = 0;
                    bVar4 = true;
                    ::std::__cxx11::ostringstream::~ostringstream(local_2980);
                    goto LAB_004c93d2;
                  }
                  s_3.t = 0.0;
                  s_3.value = 0.0;
                  for (; AVar2 = s_3,
                      AVar23 = (AnimationSample<float>)
                               ::std::vector<float,_std::allocator<float>_>::size(&in_02->value),
                      (ulong)AVar2 < (ulong)AVar23; s_3 = (AnimationSample<float>)((long)s_3 + 1)) {
                    AnimationSample<float>::AnimationSample((AnimationSample<float> *)&targetName);
                    targetName._0_4_ = (float)in_02->t;
                    pvVar24 = ::std::vector<float,_std::allocator<float>_>::operator[]
                                        (&in_02->value,(size_type)s_3);
                    targetName._4_4_ = *pvVar24;
                    pvVar26 = ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::
                              operator[]((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                          *)local_470,(size_type)s_3);
                    ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage =
                         (pointer)Token::str_abi_cxx11_(pvVar26);
                    pmVar28 = ::std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
                              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
                                            *)&__range4_3,
                                           (key_type *)
                                           ws.super__Vector_base<float,_std::allocator<float>_>.
                                           _M_impl.super__Vector_impl_data._M_end_of_storage);
                    ::std::
                    vector<tinyusdz::tydra::AnimationSample<float>,_std::allocator<tinyusdz::tydra::AnimationSample<float>_>_>
                    ::push_back(&pmVar28->samples,(value_type *)&targetName);
                  }
                }
                __gnu_cxx::
                __normal_iterator<const_tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample_*,_std::vector<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>_>
                ::operator++(&__end5);
              }
            }
            bVar4 = Animatable<std::vector<float,_std::allocator<float>_>_>::has_default
                              ((Animatable<std::vector<float,_std::allocator<float>_>_> *)local_2600
                              );
            if (bVar4) {
              ::std::vector<float,_std::allocator<float>_>::vector
                        ((vector<float,_std::allocator<float>_> *)local_2a28);
              bVar4 = Animatable<std::vector<float,_std::allocator<float>_>_>::get_scalar
                                ((Animatable<std::vector<float,_std::allocator<float>_>_> *)
                                 local_2600,(vector<float,_std::allocator<float>_> *)local_2a28);
              if (bVar4) {
                sVar5 = ::std::vector<float,_std::allocator<float>_>::size
                                  ((vector<float,_std::allocator<float>_> *)local_2a28);
                sVar25 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                                   ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                    local_470);
                if (sVar5 == sVar25) {
                  local_2e00 = 0;
                  while (uVar31 = local_2e00,
                        sVar5 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                                          ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                            *)local_470), uVar31 < sVar5) {
                    value_00 = ::std::vector<float,_std::allocator<float>_>::operator[]
                                         ((vector<float,_std::allocator<float>_> *)local_2a28,
                                          local_2e00);
                    nonstd::optional_lite::optional<float>::optional<float_&,_0>
                              (&local_2e08,value_00);
                    pvVar26 = ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::
                              operator[]((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                          *)local_470,local_2e00);
                    psVar27 = Token::str_abi_cxx11_(pvVar26);
                    pmVar28 = ::std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
                              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
                                            *)&__range4_3,psVar27);
                    nonstd::optional_lite::optional<float>::operator=
                              (&pmVar28->static_value,&local_2e08);
                    nonstd::optional_lite::optional<float>::~optional(&local_2e08);
                    local_2e00 = local_2e00 + 1;
                  }
                  bVar4 = false;
                }
                else {
                  ::std::__cxx11::ostringstream::ostringstream(local_2d80);
                  poVar6 = ::std::operator<<((ostream *)local_2d80,"[error]");
                  poVar6 = ::std::operator<<(poVar6,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                            );
                  poVar6 = ::std::operator<<(poVar6,":");
                  poVar6 = ::std::operator<<(poVar6,"ConvertSkelAnimation");
                  poVar6 = ::std::operator<<(poVar6,"():");
                  poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x1670);
                  ::std::operator<<(poVar6," ");
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::string
                            (local_2dc0,
                             "blendShapeWeights.size {} must be equal to blendShapes.size {} : {}",
                             (allocator *)(local_2dd0 + 0xf));
                  local_2dd0._0_8_ =
                       ::std::vector<float,_std::allocator<float>_>::size
                                 ((vector<float,_std::allocator<float>_> *)local_2a28);
                  local_2dd8 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                                         ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                           *)local_470);
                  fmt::format<unsigned_long,unsigned_long,tinyusdz::Path>
                            (&local_2da0,(fmt *)local_2dc0,(string *)local_2dd0,&local_2dd8,
                             (unsigned_long *)abs_path,in_R9);
                  poVar6 = ::std::operator<<((ostream *)local_2d80,(string *)&local_2da0);
                  ::std::operator<<(poVar6,"\n");
                  ::std::__cxx11::string::~string((string *)&local_2da0);
                  ::std::__cxx11::string::~string(local_2dc0);
                  ::std::allocator<char>::~allocator((allocator<char> *)(local_2dd0 + 0xf));
                  ::std::__cxx11::ostringstream::str();
                  PushError(this,(string *)&i);
                  ::std::__cxx11::string::~string((string *)&i);
                  this_local._7_1_ = 0;
                  bVar4 = true;
                  ::std::__cxx11::ostringstream::~ostringstream(local_2d80);
                }
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_2ba0);
                poVar6 = ::std::operator<<((ostream *)local_2ba0,"[error]");
                poVar6 = ::std::operator<<(poVar6,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                          );
                poVar6 = ::std::operator<<(poVar6,":");
                poVar6 = ::std::operator<<(poVar6,"ConvertSkelAnimation");
                poVar6 = ::std::operator<<(poVar6,"():");
                poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x166c);
                ::std::operator<<(poVar6," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          ((string *)&local_2be0,
                           "Failed to get default value of `blendShapeWeights` attribute of SkelAnimation is invalid : {}"
                           ,&local_2be1);
                fmt::format<tinyusdz::Path>(&local_2bc0,&local_2be0,abs_path);
                poVar6 = ::std::operator<<((ostream *)local_2ba0,(string *)&local_2bc0);
                ::std::operator<<(poVar6,"\n");
                ::std::__cxx11::string::~string((string *)&local_2bc0);
                ::std::__cxx11::string::~string((string *)&local_2be0);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_2be1);
                ::std::__cxx11::ostringstream::str();
                PushError(this,&local_2c08);
                ::std::__cxx11::string::~string((string *)&local_2c08);
                this_local._7_1_ = 0;
                bVar4 = true;
                ::std::__cxx11::ostringstream::~ostringstream(local_2ba0);
              }
              ::std::vector<float,_std::allocator<float>_>::~vector
                        ((vector<float,_std::allocator<float>_> *)local_2a28);
              if (!bVar4) {
                bVar4 = false;
              }
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream(local_2f80);
              poVar6 = ::std::operator<<((ostream *)local_2f80,"[error]");
              poVar6 = ::std::operator<<(poVar6,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                        );
              poVar6 = ::std::operator<<(poVar6,":");
              poVar6 = ::std::operator<<(poVar6,"ConvertSkelAnimation");
              poVar6 = ::std::operator<<(poVar6,"():");
              poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x1678);
              ::std::operator<<(poVar6," ");
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        ((string *)&local_2fc0,
                         "Internal error. `blendShapeWeights` attribute of SkelAnimation is invalid : {}"
                         ,&local_2fc1);
              fmt::format<tinyusdz::Path>(&local_2fa0,&local_2fc0,abs_path);
              poVar6 = ::std::operator<<((ostream *)local_2f80,(string *)&local_2fa0);
              ::std::operator<<(poVar6,"\n");
              ::std::__cxx11::string::~string((string *)&local_2fa0);
              ::std::__cxx11::string::~string((string *)&local_2fc0);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_2fc1);
              ::std::__cxx11::ostringstream::str();
              PushError(this,&local_2fe8);
              ::std::__cxx11::string::~string((string *)&local_2fe8);
              this_local._7_1_ = 0;
              bVar4 = true;
              ::std::__cxx11::ostringstream::~ostringstream(local_2f80);
            }
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_2778);
            poVar6 = ::std::operator<<((ostream *)local_2778,"[error]");
            poVar6 = ::std::operator<<(poVar6,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                      );
            poVar6 = ::std::operator<<(poVar6,":");
            poVar6 = ::std::operator<<(poVar6,"ConvertSkelAnimation");
            poVar6 = ::std::operator<<(poVar6,"():");
            poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x164f);
            ::std::operator<<(poVar6," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)&local_27b8,
                       "Failed to get `blendShapeWeights` attribute of SkelAnimation. Maybe ValueBlock or connection? : {}"
                       ,&local_27b9);
            fmt::format<tinyusdz::Path>(&local_2798,&local_27b8,abs_path);
            poVar6 = ::std::operator<<((ostream *)local_2778,(string *)&local_2798);
            ::std::operator<<(poVar6,"\n");
            ::std::__cxx11::string::~string((string *)&local_2798);
            ::std::__cxx11::string::~string((string *)&local_27b8);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_27b9);
            ::std::__cxx11::ostringstream::str();
            PushError(this,(string *)&ts_weights);
            ::std::__cxx11::string::~string((string *)&ts_weights);
            this_local._7_1_ = 0;
            bVar4 = true;
            ::std::__cxx11::ostringstream::~ostringstream(local_2778);
          }
LAB_004c93d2:
          Animatable<std::vector<float,_std::allocator<float>_>_>::~Animatable
                    ((Animatable<std::vector<float,_std::allocator<float>_>_> *)local_2600);
          if (!bVar4) goto LAB_004c93ec;
        }
        ::std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
        ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
                *)&__range4_3);
        if (bVar4) goto LAB_004c94d0;
      }
      Path::full_path_name_abi_cxx11_(&local_3008,abs_path);
      ::std::__cxx11::string::operator=
                ((string *)
                 (joints.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage + 1),(string *)&local_3008);
      ::std::__cxx11::string::~string((string *)&local_3008);
      ::std::__cxx11::string::operator=
                ((string *)
                 joints.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage,(string *)skelAnim);
      pPVar29 = SkelAnimation::metas(skelAnim);
      nonstd::optional_lite::optional<std::__cxx11::string>::value_or<char_const(&)[1]>
                (&local_3028,(optional<std::__cxx11::string> *)&pPVar29->displayName,
                 (char (*) [1])0xa0bae3);
      ::std::__cxx11::string::operator=
                ((string *)
                 (joints.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage + 2),(string *)&local_3028);
      ::std::__cxx11::string::~string((string *)&local_3028);
      ::std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
      ::operator=((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                   *)(joints.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 3),
                  (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                   *)&jointIdMap._s_to_i._M_t._M_impl.super__Rb_tree_header._M_node_count);
      this_local._7_1_ = 1;
    }
    else {
      StringAndIdMap::StringAndIdMap((StringAndIdMap *)&__range3);
      __end3._M_current =
           (Token *)std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::begin
                              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_50
                              );
      joint = (Token *)std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::end
                                 ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                  local_50);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<tinyusdz::Token_*,_std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                                         *)&joint), bVar4) {
        this_00 = __gnu_cxx::
                  __normal_iterator<tinyusdz::Token_*,_std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                  ::operator*(&__end3);
        translations._ts._24_8_ = StringAndIdMap::size((StringAndIdMap *)&__range3);
        psVar27 = Token::str_abi_cxx11_(this_00);
        StringAndIdMap::add((StringAndIdMap *)&__range3,psVar27,translations._ts._24_8_);
        __gnu_cxx::
        __normal_iterator<tinyusdz::Token_*,_std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
        ::operator++(&__end3);
      }
      Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::
      Animatable((Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                  *)local_950);
      bVar4 = TypedAttribute<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
              ::get_value(&skelAnim->translations,
                          (Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                           *)local_950);
      if (bVar4) {
        Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::
        Animatable((Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                    *)local_b70);
        bVar4 = TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
                ::get_value(&skelAnim->rotations,
                            (Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                             *)local_b70);
        if (bVar4) {
          Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
          ::Animatable((Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                        *)local_d90);
          bVar4 = TypedAttribute<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
                  ::get_value(&skelAnim->scales,
                              (Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                               *)local_d90);
          if (bVar4) {
            bVar4 = Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                    ::has_timesamples((Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                                       *)local_950);
            if (bVar4) {
              this_01 = Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                        ::get_timesamples((Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                                           *)local_950);
              pvVar7 = TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                       ::get_samples(this_01);
              bVar4 = ::std::
                      vector<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
                      ::empty(pvVar7);
              if (bVar4) {
                ::std::__cxx11::ostringstream::ostringstream(local_10f0);
                poVar6 = ::std::operator<<((ostream *)local_10f0,"[error]");
                poVar6 = ::std::operator<<(poVar6,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                          );
                poVar6 = ::std::operator<<(poVar6,":");
                poVar6 = ::std::operator<<(poVar6,"ConvertSkelAnimation");
                poVar6 = ::std::operator<<(poVar6,"():");
                poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x1571);
                ::std::operator<<(poVar6," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          ((string *)&local_1130,
                           "`translations` timeSamples in SkelAnimation is empty : {}",&local_1131);
                fmt::format<tinyusdz::Path>(&local_1110,&local_1130,abs_path);
                poVar6 = ::std::operator<<((ostream *)local_10f0,(string *)&local_1110);
                ::std::operator<<(poVar6,"\n");
                ::std::__cxx11::string::~string((string *)&local_1110);
                ::std::__cxx11::string::~string((string *)&local_1130);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_1131);
                ::std::__cxx11::ostringstream::str();
                PushError(this,(string *)&__range4);
                ::std::__cxx11::string::~string((string *)&__range4);
                this_local._7_1_ = 0;
                bVar4 = true;
                ::std::__cxx11::ostringstream::~ostringstream(local_10f0);
                goto LAB_004c8838;
              }
              pvVar7 = TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                       ::get_samples(this_01);
              __end4 = ::std::
                       vector<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
                       ::begin(pvVar7);
              sample = (Sample *)
                       ::std::
                       vector<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
                       ::end(pvVar7);
              while (bVar4 = __gnu_cxx::operator!=
                                       (&__end4,(__normal_iterator<const_tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample_*,_std::vector<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>_>
                                                 *)&sample), bVar4) {
                in = __gnu_cxx::
                     __normal_iterator<const_tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample_*,_std::vector<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>_>
                     ::operator*(&__end4);
                if ((in->blocked & 1U) == 0) {
                  sVar5 = ::std::
                          vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                          size(&in->value);
                  sVar25 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                                     ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                      local_50);
                  if (sVar5 != sVar25) {
                    ::std::__cxx11::ostringstream::ostringstream(local_12f0);
                    poVar6 = ::std::operator<<((ostream *)local_12f0,"[error]");
                    poVar6 = ::std::operator<<(poVar6,
                                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                              );
                    poVar6 = ::std::operator<<(poVar6,":");
                    poVar6 = ::std::operator<<(poVar6,"ConvertSkelAnimation");
                    poVar6 = ::std::operator<<(poVar6,"():");
                    poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x1578);
                    ::std::operator<<(poVar6," ");
                    ::std::allocator<char>::allocator();
                    ::std::__cxx11::string::string
                              (local_1330,
                               "Array length mismatch in SkelAnimation. timeCode {} translations.size {} must be equal to joints.size {} : {}"
                               ,&local_1331);
                    local_1340 = (double)::std::
                                         vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                         ::size(&in->value);
                    local_1348 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::
                                 size((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                      local_50);
                    in_R9 = abs_path;
                    fmt::format<double,unsigned_long,unsigned_long,tinyusdz::Path>
                              (&local_1310,(fmt *)local_1330,(string *)in,&local_1340,&local_1348,
                               (unsigned_long *)abs_path,in_stack_ffffffffffffced8);
                    poVar6 = ::std::operator<<((ostream *)local_12f0,(string *)&local_1310);
                    ::std::operator<<(poVar6,"\n");
                    ::std::__cxx11::string::~string((string *)&local_1310);
                    ::std::__cxx11::string::~string(local_1330);
                    ::std::allocator<char>::~allocator((allocator<char> *)&local_1331);
                    ::std::__cxx11::ostringstream::str();
                    PushError(this,(string *)&j);
                    ::std::__cxx11::string::~string((string *)&j);
                    this_local._7_1_ = 0;
                    bVar4 = true;
                    ::std::__cxx11::ostringstream::~ostringstream(local_12f0);
                    goto LAB_004c8838;
                  }
                  s.value._M_elems[1] = 0.0;
                  s.value._M_elems[2] = 0.0;
                  for (; sVar5 = ::std::
                                 vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                 ::size(&in->value), (ulong)s.value._M_elems._4_8_ < sVar5;
                      s.value._M_elems._4_8_ = s.value._M_elems._4_8_ + 1) {
                    AnimationSample<std::array<float,_3UL>_>::AnimationSample
                              ((AnimationSample<std::array<float,_3UL>_> *)
                               ((long)&jointName.field_2 + 8));
                    jointName.field_2._8_4_ = (undefined4)in->t;
                    pvVar8 = ::std::
                             vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                             ::operator[](&in->value,s.value._M_elems._4_8_);
                    unique0x00012000 = *(undefined8 *)pvVar8->_M_elems;
                    StringAndIdMap::at_abi_cxx11_
                              ((string *)&it,(StringAndIdMap *)&__range3,s.value._M_elems._4_8_);
                    pmVar20 = ::std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                                            *)&jointIdMap._s_to_i._M_t._M_impl.super__Rb_tree_header
                                               ._M_node_count,(key_type *)&it);
                    ts_rots._4_4_ = 1;
                    local_13a8 = ::std::
                                 map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                                 ::operator[](pmVar20,(key_type *)((long)&ts_rots + 4));
                    bVar4 = ::std::
                            vector<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>_>_>
                            ::empty(&(local_13a8->translations).samples);
                    if (bVar4) {
                      local_13a8->type = Translation;
                    }
                    ::std::
                    vector<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>_>_>
                    ::push_back(&(local_13a8->translations).samples,
                                (value_type *)((long)&jointName.field_2 + 8));
                    ::std::__cxx11::string::~string((string *)&it);
                  }
                }
                __gnu_cxx::
                __normal_iterator<const_tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample_*,_std::vector<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>_>
                ::operator++(&__end4);
              }
            }
            bVar4 = Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                    ::has_timesamples((Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                                       *)local_b70);
            if (bVar4) {
              this_02 = Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                        ::get_timesamples((Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                                           *)local_b70);
              this_03 = TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                        ::get_samples(this_02);
              __end4_1 = ::std::
                         vector<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
                         ::begin(this_03);
              sample_1 = (Sample *)
                         ::std::
                         vector<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
                         ::end(this_03);
              while (bVar4 = __gnu_cxx::operator!=
                                       (&__end4_1,
                                        (__normal_iterator<const_tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample_*,_std::vector<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>_>
                                         *)&sample_1), bVar4) {
                in_00 = __gnu_cxx::
                        __normal_iterator<const_tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample_*,_std::vector<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>_>
                        ::operator*(&__end4_1);
                if ((in_00->blocked & 1U) == 0) {
                  sVar5 = ::std::
                          vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::
                          size(&in_00->value);
                  sVar25 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                                     ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                      local_50);
                  if (sVar5 != sVar25) {
                    ::std::__cxx11::ostringstream::ostringstream(local_1550);
                    poVar6 = ::std::operator<<((ostream *)local_1550,"[error]");
                    poVar6 = ::std::operator<<(poVar6,
                                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                              );
                    poVar6 = ::std::operator<<(poVar6,":");
                    poVar6 = ::std::operator<<(poVar6,"ConvertSkelAnimation");
                    poVar6 = ::std::operator<<(poVar6,"():");
                    poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x1592);
                    ::std::operator<<(poVar6," ");
                    ::std::allocator<char>::allocator();
                    ::std::__cxx11::string::string
                              (local_1590,
                               "Array length mismatch in SkelAnimation. timeCode {} rotations.size {} must be equal to joints.size {} : {}"
                               ,&local_1591);
                    local_15a0 = (double)::std::
                                         vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                         ::size(&in_00->value);
                    local_15a8 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::
                                 size((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                      local_50);
                    in_R9 = abs_path;
                    fmt::format<double,unsigned_long,unsigned_long,tinyusdz::Path>
                              (&local_1570,(fmt *)local_1590,(string *)in_00,&local_15a0,&local_15a8
                               ,(unsigned_long *)abs_path,in_stack_ffffffffffffced8);
                    poVar6 = ::std::operator<<((ostream *)local_1550,(string *)&local_1570);
                    ::std::operator<<(poVar6,"\n");
                    ::std::__cxx11::string::~string((string *)&local_1570);
                    ::std::__cxx11::string::~string(local_1590);
                    ::std::allocator<char>::~allocator((allocator<char> *)&local_1591);
                    ::std::__cxx11::ostringstream::str();
                    PushError(this,(string *)&j_1);
                    ::std::__cxx11::string::~string((string *)&j_1);
                    this_local._7_1_ = 0;
                    bVar4 = true;
                    ::std::__cxx11::ostringstream::~ostringstream(local_1550);
                    goto LAB_004c8838;
                  }
                  s_1.value._M_elems[2] = 0.0;
                  s_1.value._M_elems[3] = 0.0;
                  for (; uVar3 = s_1.value._M_elems._8_8_,
                      sVar5 = ::std::
                              vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                              ::size(&in_00->value), (ulong)uVar3 < sVar5;
                      s_1.value._M_elems._8_8_ = s_1.value._M_elems._8_8_ + 1) {
                    AnimationSample<std::array<float,_4UL>_>::AnimationSample
                              ((AnimationSample<std::array<float,_4UL>_> *)
                               ((long)&jointName_1.field_2 + 0xc));
                    jointName_1.field_2._12_4_ = (undefined4)in_00->t;
                    pvVar9 = ::std::
                             vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                             ::operator[](&in_00->value,s_1.value._M_elems._8_8_);
                    fVar30 = tinyusdz::value::quatf::operator[](pvVar9,0);
                    pvVar10 = ::std::array<float,_4UL>::operator[]
                                        ((array<float,_4UL> *)auStack_15e0,0);
                    *pvVar10 = fVar30;
                    pvVar9 = ::std::
                             vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                             ::operator[](&in_00->value,s_1.value._M_elems._8_8_);
                    fVar30 = tinyusdz::value::quatf::operator[](pvVar9,1);
                    pvVar10 = ::std::array<float,_4UL>::operator[]
                                        ((array<float,_4UL> *)auStack_15e0,1);
                    *pvVar10 = fVar30;
                    pvVar9 = ::std::
                             vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                             ::operator[](&in_00->value,s_1.value._M_elems._8_8_);
                    fVar30 = tinyusdz::value::quatf::operator[](pvVar9,2);
                    pvVar10 = ::std::array<float,_4UL>::operator[]
                                        ((array<float,_4UL> *)auStack_15e0,2);
                    *pvVar10 = fVar30;
                    pvVar9 = ::std::
                             vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                             ::operator[](&in_00->value,s_1.value._M_elems._8_8_);
                    fVar30 = tinyusdz::value::quatf::operator[](pvVar9,3);
                    pvVar10 = ::std::array<float,_4UL>::operator[]
                                        ((array<float,_4UL> *)auStack_15e0,3);
                    *pvVar10 = fVar30;
                    StringAndIdMap::at_abi_cxx11_
                              ((string *)&it_1,(StringAndIdMap *)&__range3,s_1.value._M_elems._8_8_)
                    ;
                    pmVar20 = ::std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                                            *)&jointIdMap._s_to_i._M_t._M_impl.super__Rb_tree_header
                                               ._M_node_count,(key_type *)&it_1);
                    ts_scales._4_4_ = 2;
                    local_1610 = ::std::
                                 map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                                 ::operator[](pmVar20,(key_type *)((long)&ts_scales + 4));
                    bVar4 = ::std::
                            vector<tinyusdz::tydra::AnimationSample<std::array<float,_4UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_4UL>_>_>_>
                            ::empty(&(local_1610->rotations).samples);
                    if (bVar4) {
                      local_1610->type = Rotation;
                    }
                    ::std::
                    vector<tinyusdz::tydra::AnimationSample<std::array<float,_4UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_4UL>_>_>_>
                    ::push_back(&(local_1610->rotations).samples,
                                (value_type *)((long)&jointName_1.field_2 + 0xc));
                    ::std::__cxx11::string::~string((string *)&it_1);
                  }
                }
                __gnu_cxx::
                __normal_iterator<const_tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample_*,_std::vector<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>_>
                ::operator++(&__end4_1);
              }
            }
            bVar4 = Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                    ::has_timesamples((Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                                       *)local_d90);
            if (bVar4) {
              this_04 = Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                        ::get_timesamples((Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                                           *)local_d90);
              this_05 = TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                        ::get_samples(this_04);
              __end4_2 = ::std::
                         vector<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample>_>
                         ::begin(this_05);
              sample_2 = (Sample *)
                         ::std::
                         vector<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample>_>
                         ::end(this_05);
              while (bVar4 = __gnu_cxx::operator!=
                                       (&__end4_2,
                                        (__normal_iterator<const_tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample_*,_std::vector<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample>_>_>
                                         *)&sample_2), bVar4) {
                in_01 = __gnu_cxx::
                        __normal_iterator<const_tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample_*,_std::vector<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample>_>_>
                        ::operator*(&__end4_2);
                if ((in_01->blocked & 1U) == 0) {
                  sVar5 = ::std::
                          vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                          ::size(&in_01->value);
                  sVar25 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                                     ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                      local_50);
                  if (sVar5 != sVar25) {
                    ::std::__cxx11::ostringstream::ostringstream(local_17b8);
                    poVar6 = ::std::operator<<((ostream *)local_17b8,"[error]");
                    poVar6 = ::std::operator<<(poVar6,
                                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                              );
                    poVar6 = ::std::operator<<(poVar6,":");
                    poVar6 = ::std::operator<<(poVar6,"ConvertSkelAnimation");
                    poVar6 = ::std::operator<<(poVar6,"():");
                    poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x15ae);
                    ::std::operator<<(poVar6," ");
                    ::std::allocator<char>::allocator();
                    ::std::__cxx11::string::string
                              (local_17f8,
                               "Array length mismatch in SkelAnimation. timeCode {} scales.size {} must be equal to joints.size {} : {}"
                               ,&local_17f9);
                    local_1808 = (double)::std::
                                         vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                         ::size(&in_01->value);
                    local_1810 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::
                                 size((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                      local_50);
                    in_R9 = abs_path;
                    fmt::format<double,unsigned_long,unsigned_long,tinyusdz::Path>
                              (&local_17d8,(fmt *)local_17f8,(string *)in_01,&local_1808,&local_1810
                               ,(unsigned_long *)abs_path,in_stack_ffffffffffffced8);
                    poVar6 = ::std::operator<<((ostream *)local_17b8,(string *)&local_17d8);
                    ::std::operator<<(poVar6,"\n");
                    ::std::__cxx11::string::~string((string *)&local_17d8);
                    ::std::__cxx11::string::~string(local_17f8);
                    ::std::allocator<char>::~allocator((allocator<char> *)&local_17f9);
                    ::std::__cxx11::ostringstream::str();
                    PushError(this,(string *)&j_2);
                    ::std::__cxx11::string::~string((string *)&j_2);
                    this_local._7_1_ = 0;
                    bVar4 = true;
                    ::std::__cxx11::ostringstream::~ostringstream(local_17b8);
                    goto LAB_004c8838;
                  }
                  s_2.value._M_elems[1] = 0.0;
                  s_2.value._M_elems[2] = 0.0;
                  for (; uVar3 = s_2.value._M_elems._4_8_,
                      sVar5 = ::std::
                              vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                              ::size(&in_01->value), (ulong)uVar3 < sVar5;
                      s_2.value._M_elems._4_8_ = s_2.value._M_elems._4_8_ + 1) {
                    AnimationSample<std::array<float,_3UL>_>::AnimationSample
                              ((AnimationSample<std::array<float,_3UL>_> *)local_1848);
                    local_1848._0_4_ = (undefined4)in_01->t;
                    pvVar11 = ::std::
                              vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                              ::operator[](&in_01->value,s_2.value._M_elems._4_8_);
                    pvVar12 = ::std::array<tinyusdz::value::half,_3UL>::operator[](pvVar11,0);
                    jointName_2.field_2._14_2_ = pvVar12->value;
                    fVar30 = tinyusdz::value::half_to_float((half)jointName_2.field_2._14_2_);
                    pvVar13 = ::std::array<float,_3UL>::operator[]
                                        ((array<float,_3UL> *)(local_1848 + 4),0);
                    *pvVar13 = fVar30;
                    pvVar11 = ::std::
                              vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                              ::operator[](&in_01->value,s_2.value._M_elems._4_8_);
                    pvVar12 = ::std::array<tinyusdz::value::half,_3UL>::operator[](pvVar11,1);
                    jointName_2.field_2._12_2_ = pvVar12->value;
                    fVar30 = tinyusdz::value::half_to_float((half)jointName_2.field_2._12_2_);
                    pvVar13 = ::std::array<float,_3UL>::operator[]
                                        ((array<float,_3UL> *)(local_1848 + 4),1);
                    *pvVar13 = fVar30;
                    pvVar11 = ::std::
                              vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                              ::operator[](&in_01->value,s_2.value._M_elems._4_8_);
                    pvVar12 = ::std::array<tinyusdz::value::half,_3UL>::operator[](pvVar11,2);
                    jointName_2.field_2._10_2_ = pvVar12->value;
                    fVar30 = tinyusdz::value::half_to_float((half)jointName_2.field_2._10_2_);
                    pvVar13 = ::std::array<float,_3UL>::operator[]
                                        ((array<float,_3UL> *)(local_1848 + 4),2);
                    *pvVar13 = fVar30;
                    StringAndIdMap::at_abi_cxx11_
                              ((string *)&it_2,(StringAndIdMap *)&__range3,s_2.value._M_elems._4_8_)
                    ;
                    pmVar20 = ::std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                                            *)&jointIdMap._s_to_i._M_t._M_impl.super__Rb_tree_header
                                               ._M_node_count,(key_type *)&it_2);
                    translation.
                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 3;
                    pmVar21 = ::std::
                              map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                              ::operator[](pmVar20,(key_type *)
                                                   ((long)&translation.
                                                                                                                      
                                                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  + 4));
                    bVar4 = ::std::
                            vector<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>_>_>
                            ::empty(&(pmVar21->scales).samples);
                    if (bVar4) {
                      pmVar21->type = Scale;
                    }
                    ::std::
                    vector<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>_>_>
                    ::push_back(&(pmVar21->scales).samples,(value_type *)local_1848);
                    ::std::__cxx11::string::~string((string *)&it_2);
                  }
                }
                __gnu_cxx::
                __normal_iterator<const_tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample_*,_std::vector<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample>_>_>
                ::operator++(&__end4_2);
              }
            }
            bVar4 = Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                    ::has_default((Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                                   *)local_950);
            if (bVar4) {
              ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
              vector((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                     local_1898);
              bVar4 = Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                      ::get_scalar((Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                                    *)local_950,
                                   (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                    *)local_1898);
              if (bVar4) {
                sVar5 = ::std::
                        vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                        size((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                              *)local_1898);
                sVar25 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                                   ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                    local_50);
                if (sVar5 == sVar25) {
                  for (jointName_3.field_2._8_8_ = 0; uVar3 = jointName_3.field_2._8_8_,
                      sVar5 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                                        ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                          *)local_50), (ulong)uVar3 < sVar5;
                      jointName_3.field_2._8_8_ = jointName_3.field_2._8_8_ + 1) {
                    StringAndIdMap::at_abi_cxx11_
                              ((string *)&it_3,(StringAndIdMap *)&__range3,jointName_3.field_2._8_8_
                              );
                    pmVar20 = ::std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                                            *)&jointIdMap._s_to_i._M_t._M_impl.super__Rb_tree_header
                                               ._M_node_count,(key_type *)&it_3);
                    rotation.
                    super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
                    pmVar21 = ::std::
                              map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                              ::operator[](pmVar20,(key_type *)
                                                   ((long)&rotation.
                                                  super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  + 4));
                    pvVar22 = ::std::
                              vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                              ::operator[]((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                            *)local_1898,jointName_3.field_2._8_8_);
                    nonstd::optional_lite::optional<std::array<float,3ul>>::operator=
                              ((optional<std::array<float,3ul>> *)&pmVar21->translations,pvVar22);
                    ::std::__cxx11::string::~string((string *)&it_3);
                  }
                  bVar4 = false;
                }
                else {
                  ::std::__cxx11::ostringstream::ostringstream(local_1bf0);
                  poVar6 = ::std::operator<<((ostream *)local_1bf0,"[error]");
                  poVar6 = ::std::operator<<(poVar6,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                            );
                  poVar6 = ::std::operator<<(poVar6,":");
                  poVar6 = ::std::operator<<(poVar6,"ConvertSkelAnimation");
                  poVar6 = ::std::operator<<(poVar6,"():");
                  poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x15d0);
                  ::std::operator<<(poVar6," ");
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::string
                            (local_1c30,
                             "Array length mismatch in SkelAnimation. translations.default.size {} must be equal to joints.size {} : {}"
                             ,(allocator *)(local_1c40 + 0xf));
                  local_1c40._0_8_ =
                       ::std::
                       vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                       size((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                             *)local_1898);
                  local_1c48 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                                         ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                           *)local_50);
                  fmt::format<unsigned_long,unsigned_long,tinyusdz::Path>
                            (&local_1c10,(fmt *)local_1c30,(string *)local_1c40,&local_1c48,
                             (unsigned_long *)abs_path,in_R9);
                  poVar6 = ::std::operator<<((ostream *)local_1bf0,(string *)&local_1c10);
                  ::std::operator<<(poVar6,"\n");
                  ::std::__cxx11::string::~string((string *)&local_1c10);
                  ::std::__cxx11::string::~string(local_1c30);
                  ::std::allocator<char>::~allocator((allocator<char> *)(local_1c40 + 0xf));
                  ::std::__cxx11::ostringstream::str();
                  PushError(this,(string *)&j_3);
                  ::std::__cxx11::string::~string((string *)&j_3);
                  this_local._7_1_ = 0;
                  bVar4 = true;
                  ::std::__cxx11::ostringstream::~ostringstream(local_1bf0);
                }
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_1a10);
                poVar6 = ::std::operator<<((ostream *)local_1a10,"[error]");
                poVar6 = ::std::operator<<(poVar6,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                          );
                poVar6 = ::std::operator<<(poVar6,":");
                poVar6 = ::std::operator<<(poVar6,"ConvertSkelAnimation");
                poVar6 = ::std::operator<<(poVar6,"():");
                poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x15cd);
                ::std::operator<<(poVar6," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          ((string *)&local_1a50,
                           "Failed to get `translations` attribute in SkelAnimation: {}",&local_1a51
                          );
                fmt::format<tinyusdz::Path>(&local_1a30,&local_1a50,abs_path);
                poVar6 = ::std::operator<<((ostream *)local_1a10,(string *)&local_1a30);
                ::std::operator<<(poVar6,"\n");
                ::std::__cxx11::string::~string((string *)&local_1a30);
                ::std::__cxx11::string::~string((string *)&local_1a50);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_1a51);
                ::std::__cxx11::ostringstream::str();
                PushError(this,&local_1a78);
                ::std::__cxx11::string::~string((string *)&local_1a78);
                this_local._7_1_ = 0;
                bVar4 = true;
                ::std::__cxx11::ostringstream::~ostringstream(local_1a10);
              }
              ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
              ~vector((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                      local_1898);
              if (bVar4) goto LAB_004c8838;
            }
            bVar4 = Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                    ::has_default((Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                                   *)local_b70);
            if (bVar4) {
              ::std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::
              vector((vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                     &_rotation.
                      super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
              ::std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::vector
                        ((vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                         local_1cd0);
              bVar4 = Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                      ::get_scalar((Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                                    *)local_b70,
                                   (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                    *)local_1cd0);
              if (bVar4) {
                sVar5 = ::std::
                        vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::
                        size((vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                              *)local_1cd0);
                sVar25 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                                   ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                    local_50);
                if (sVar5 == sVar25) {
                  iVar14 = ::std::
                           vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::
                           begin((vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                  *)local_1cd0);
                  iVar15 = ::std::
                           vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::
                           end((vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                *)local_1cd0);
                  bVar16 = ::std::
                           back_inserter<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>
                                     ((vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                                       *)&_rotation.
                                          super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  ::std::
                  transform<__gnu_cxx::__normal_iterator<tinyusdz::value::quatf*,std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>,std::back_insert_iterator<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>,tinyusdz::tydra::RenderSceneConverter::ConvertSkelAnimation(tinyusdz::tydra::RenderSceneConverterEnv_const&,tinyusdz::Path_const&,tinyusdz::SkelAnimation_const&,tinyusdz::tydra::Animation*)::__0>
                            (iVar14._M_current,iVar15._M_current,bVar16.container);
                  for (jointName_4.field_2._8_8_ = 0; uVar3 = jointName_4.field_2._8_8_,
                      sVar5 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                                        ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                          *)local_50), (ulong)uVar3 < sVar5;
                      jointName_4.field_2._8_8_ = jointName_4.field_2._8_8_ + 1) {
                    StringAndIdMap::at_abi_cxx11_
                              ((string *)&it_4,(StringAndIdMap *)&__range3,jointName_4.field_2._8_8_
                              );
                    pmVar20 = ::std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                                            *)&jointIdMap._s_to_i._M_t._M_impl.super__Rb_tree_header
                                               ._M_node_count,(key_type *)&it_4);
                    scale.
                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 2;
                    pmVar21 = ::std::
                              map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                              ::operator[](pmVar20,(key_type *)
                                                   ((long)&scale.
                                                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  + 4));
                    value = ::std::
                            vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                            ::operator[]((vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                                          *)&_rotation.
                                             super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                         jointName_4.field_2._8_8_);
                    nonstd::optional_lite::optional<std::array<float,4ul>>::operator=
                              ((optional<std::array<float,4ul>> *)&pmVar21->rotations,value);
                    ::std::__cxx11::string::~string((string *)&it_4);
                  }
                  bVar4 = false;
                }
                else {
                  ::std::__cxx11::ostringstream::ostringstream(local_2028);
                  poVar6 = ::std::operator<<((ostream *)local_2028,"[error]");
                  poVar6 = ::std::operator<<(poVar6,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                            );
                  poVar6 = ::std::operator<<(poVar6,":");
                  poVar6 = ::std::operator<<(poVar6,"ConvertSkelAnimation");
                  poVar6 = ::std::operator<<(poVar6,"():");
                  poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x15e2);
                  ::std::operator<<(poVar6," ");
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::string
                            (local_2068,
                             "Array length mismatch in SkelAnimation. rotations.default.size {} must be equal to joints.size {} : {}"
                             ,(allocator *)(local_2078 + 0xf));
                  local_2078._0_8_ =
                       ::std::
                       vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::size
                                 ((vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                   *)local_1cd0);
                  local_2080 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                                         ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                           *)local_50);
                  fmt::format<unsigned_long,unsigned_long,tinyusdz::Path>
                            (&local_2048,(fmt *)local_2068,(string *)local_2078,&local_2080,
                             (unsigned_long *)abs_path,in_R9);
                  poVar6 = ::std::operator<<((ostream *)local_2028,(string *)&local_2048);
                  ::std::operator<<(poVar6,"\n");
                  ::std::__cxx11::string::~string((string *)&local_2048);
                  ::std::__cxx11::string::~string(local_2068);
                  ::std::allocator<char>::~allocator((allocator<char> *)(local_2078 + 0xf));
                  ::std::__cxx11::ostringstream::str();
                  PushError(this,&local_20a0);
                  ::std::__cxx11::string::~string((string *)&local_20a0);
                  this_local._7_1_ = 0;
                  bVar4 = true;
                  ::std::__cxx11::ostringstream::~ostringstream(local_2028);
                }
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_1e48);
                poVar6 = ::std::operator<<((ostream *)local_1e48,"[error]");
                poVar6 = ::std::operator<<(poVar6,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                          );
                poVar6 = ::std::operator<<(poVar6,":");
                poVar6 = ::std::operator<<(poVar6,"ConvertSkelAnimation");
                poVar6 = ::std::operator<<(poVar6,"():");
                poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x15df);
                ::std::operator<<(poVar6," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          ((string *)&local_1e88,
                           "Failed to get `rotations` attribute in SkelAnimation: {}",&local_1e89);
                fmt::format<tinyusdz::Path>(&local_1e68,&local_1e88,abs_path);
                poVar6 = ::std::operator<<((ostream *)local_1e48,(string *)&local_1e68);
                ::std::operator<<(poVar6,"\n");
                ::std::__cxx11::string::~string((string *)&local_1e68);
                ::std::__cxx11::string::~string((string *)&local_1e88);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_1e89);
                ::std::__cxx11::ostringstream::str();
                PushError(this,&local_1eb0);
                ::std::__cxx11::string::~string((string *)&local_1eb0);
                this_local._7_1_ = 0;
                bVar4 = true;
                ::std::__cxx11::ostringstream::~ostringstream(local_1e48);
              }
              ::std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::
              ~vector((vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> *)
                      local_1cd0);
              ::std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::
              ~vector((vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                      &_rotation.
                       super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
              if (bVar4) goto LAB_004c8838;
            }
            bVar4 = Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                    ::has_default((Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                                   *)local_d90);
            if (bVar4) {
              ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
              vector((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                     &_scale.
                      super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
              ::std::
              vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
              ::vector((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                        *)local_2130);
              bVar4 = Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                      ::get_scalar((Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                                    *)local_d90,
                                   (vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                    *)local_2130);
              if (bVar4) {
                sVar5 = ::std::
                        vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                        ::size((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                *)local_2130);
                sVar25 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                                   ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                    local_50);
                if (sVar5 == sVar25) {
                  iVar17 = ::std::
                           vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                           ::begin((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                    *)local_2130);
                  iVar18 = ::std::
                           vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                           ::end((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                  *)local_2130);
                  bVar19 = ::std::
                           back_inserter<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
                                     ((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                       *)&_scale.
                                          super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  ::std::
                  transform<__gnu_cxx::__normal_iterator<std::array<tinyusdz::value::half,3ul>*,std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>,std::back_insert_iterator<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>,tinyusdz::tydra::RenderSceneConverter::ConvertSkelAnimation(tinyusdz::tydra::RenderSceneConverterEnv_const&,tinyusdz::Path_const&,tinyusdz::SkelAnimation_const&,tinyusdz::tydra::Animation*)::__1>
                            (iVar17._M_current,iVar18._M_current,bVar19.container);
                  for (jointName_5.field_2._8_8_ = 0; uVar3 = jointName_5.field_2._8_8_,
                      sVar5 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                                        ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                          *)local_50), (ulong)uVar3 < sVar5;
                      jointName_5.field_2._8_8_ = jointName_5.field_2._8_8_ + 1) {
                    StringAndIdMap::at_abi_cxx11_
                              ((string *)&it_5,(StringAndIdMap *)&__range3,jointName_5.field_2._8_8_
                              );
                    pmVar20 = ::std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                                            *)&jointIdMap._s_to_i._M_t._M_impl.super__Rb_tree_header
                                               ._M_node_count,(key_type *)&it_5);
                    weightsMap._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 3;
                    pmVar21 = ::std::
                              map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                              ::operator[](pmVar20,(key_type *)
                                                   ((long)&weightsMap._M_t._M_impl.
                                                           super__Rb_tree_header._M_node_count + 4))
                    ;
                    pvVar22 = ::std::
                              vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                              ::operator[]((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                            *)&_scale.
                                               super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                           jointName_5.field_2._8_8_);
                    nonstd::optional_lite::optional<std::array<float,3ul>>::operator=
                              ((optional<std::array<float,3ul>> *)&pmVar21->scales,pvVar22);
                    ::std::__cxx11::string::~string((string *)&it_5);
                  }
                  bVar4 = false;
                }
                else {
                  ::std::__cxx11::ostringstream::ostringstream(local_2488);
                  poVar6 = ::std::operator<<((ostream *)local_2488,"[error]");
                  poVar6 = ::std::operator<<(poVar6,
                                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                            );
                  poVar6 = ::std::operator<<(poVar6,":");
                  poVar6 = ::std::operator<<(poVar6,"ConvertSkelAnimation");
                  poVar6 = ::std::operator<<(poVar6,"():");
                  poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x15fd);
                  ::std::operator<<(poVar6," ");
                  ::std::allocator<char>::allocator();
                  ::std::__cxx11::string::string
                            (local_24c8,
                             "Array length mismatch in SkelAnimation. scale.default.size {} must be equal to joints.size {} : {}"
                             ,(allocator *)(local_24d8 + 0xf));
                  local_24d8._0_8_ =
                       ::std::
                       vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                       ::size((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                               *)local_2130);
                  local_24e0 = std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::size
                                         ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                           *)local_50);
                  fmt::format<unsigned_long,unsigned_long,tinyusdz::Path>
                            (&local_24a8,(fmt *)local_24c8,(string *)local_24d8,&local_24e0,
                             (unsigned_long *)abs_path,in_R9);
                  poVar6 = ::std::operator<<((ostream *)local_2488,(string *)&local_24a8);
                  ::std::operator<<(poVar6,"\n");
                  ::std::__cxx11::string::~string((string *)&local_24a8);
                  ::std::__cxx11::string::~string(local_24c8);
                  ::std::allocator<char>::~allocator((allocator<char> *)(local_24d8 + 0xf));
                  ::std::__cxx11::ostringstream::str();
                  PushError(this,&local_2500);
                  ::std::__cxx11::string::~string((string *)&local_2500);
                  this_local._7_1_ = 0;
                  bVar4 = true;
                  ::std::__cxx11::ostringstream::~ostringstream(local_2488);
                }
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream(local_22a8);
                poVar6 = ::std::operator<<((ostream *)local_22a8,"[error]");
                poVar6 = ::std::operator<<(poVar6,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                          );
                poVar6 = ::std::operator<<(poVar6,":");
                poVar6 = ::std::operator<<(poVar6,"ConvertSkelAnimation");
                poVar6 = ::std::operator<<(poVar6,"():");
                poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x15fa);
                ::std::operator<<(poVar6," ");
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          ((string *)&local_22e8,
                           "Failed to get `scales` attribute in SkelAnimation: {}",&local_22e9);
                fmt::format<tinyusdz::Path>(&local_22c8,&local_22e8,abs_path);
                poVar6 = ::std::operator<<((ostream *)local_22a8,(string *)&local_22c8);
                ::std::operator<<(poVar6,"\n");
                ::std::__cxx11::string::~string((string *)&local_22c8);
                ::std::__cxx11::string::~string((string *)&local_22e8);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_22e9);
                ::std::__cxx11::ostringstream::str();
                PushError(this,&local_2310);
                ::std::__cxx11::string::~string((string *)&local_2310);
                this_local._7_1_ = 0;
                bVar4 = true;
                ::std::__cxx11::ostringstream::~ostringstream(local_22a8);
              }
              ::std::
              vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
              ::~vector((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                         *)local_2130);
              ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
              ~vector((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                      &_scale.
                       super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
              if (bVar4) goto LAB_004c8838;
            }
            bVar4 = false;
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream(local_f08);
            poVar6 = ::std::operator<<((ostream *)local_f08,"[error]");
            poVar6 = ::std::operator<<(poVar6,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                      );
            poVar6 = ::std::operator<<(poVar6,":");
            poVar6 = ::std::operator<<(poVar6,"ConvertSkelAnimation");
            poVar6 = ::std::operator<<(poVar6,"():");
            poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x155e);
            ::std::operator<<(poVar6," ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)&local_f48,
                       "Failed to get `scales` attribute of SkelAnimation. Maybe ValueBlock or connection? : {}"
                       ,&local_f49);
            fmt::format<tinyusdz::Path>(&local_f28,&local_f48,abs_path);
            poVar6 = ::std::operator<<((ostream *)local_f08,(string *)&local_f28);
            ::std::operator<<(poVar6,"\n");
            ::std::__cxx11::string::~string((string *)&local_f28);
            ::std::__cxx11::string::~string((string *)&local_f48);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_f49);
            ::std::__cxx11::ostringstream::str();
            PushError(this,(string *)&ts_txs);
            ::std::__cxx11::string::~string((string *)&ts_txs);
            this_local._7_1_ = 0;
            bVar4 = true;
            ::std::__cxx11::ostringstream::~ostringstream(local_f08);
          }
LAB_004c8838:
          Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
          ::~Animatable((Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                         *)local_d90);
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(local_ce8);
          poVar6 = ::std::operator<<((ostream *)local_ce8,"[error]");
          poVar6 = ::std::operator<<(poVar6,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                    );
          poVar6 = ::std::operator<<(poVar6,":");
          poVar6 = ::std::operator<<(poVar6,"ConvertSkelAnimation");
          poVar6 = ::std::operator<<(poVar6,"():");
          poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x1559);
          ::std::operator<<(poVar6," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)&local_d28,
                     "Failed to get `rotations` attribute of SkelAnimation. Maybe ValueBlock or connection? : {}"
                     ,&local_d29);
          fmt::format<tinyusdz::Path>(&local_d08,&local_d28,abs_path);
          poVar6 = ::std::operator<<((ostream *)local_ce8,(string *)&local_d08);
          ::std::operator<<(poVar6,"\n");
          ::std::__cxx11::string::~string((string *)&local_d08);
          ::std::__cxx11::string::~string((string *)&local_d28);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_d29);
          ::std::__cxx11::ostringstream::str();
          PushError(this,(string *)&scales._ts._dirty);
          ::std::__cxx11::string::~string((string *)&scales._ts._dirty);
          this_local._7_1_ = 0;
          bVar4 = true;
          ::std::__cxx11::ostringstream::~ostringstream(local_ce8);
        }
        Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::
        ~Animatable((Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                     *)local_b70);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_ac8);
        poVar6 = ::std::operator<<((ostream *)local_ac8,"[error]");
        poVar6 = ::std::operator<<(poVar6,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                  );
        poVar6 = ::std::operator<<(poVar6,":");
        poVar6 = ::std::operator<<(poVar6,"ConvertSkelAnimation");
        poVar6 = ::std::operator<<(poVar6,"():");
        poVar6 = (ostream *)::std::ostream::operator<<(poVar6,0x1554);
        ::std::operator<<(poVar6," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&local_b08,
                   "Failed to get `translations` attribute of SkelAnimation. Maybe ValueBlock or connection? : {}"
                   ,&local_b09);
        fmt::format<tinyusdz::Path>(&local_ae8,&local_b08,abs_path);
        poVar6 = ::std::operator<<((ostream *)local_ac8,(string *)&local_ae8);
        ::std::operator<<(poVar6,"\n");
        ::std::__cxx11::string::~string((string *)&local_ae8);
        ::std::__cxx11::string::~string((string *)&local_b08);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_b09);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)&rotations._ts._dirty);
        ::std::__cxx11::string::~string((string *)&rotations._ts._dirty);
        this_local._7_1_ = 0;
        bVar4 = true;
        ::std::__cxx11::ostringstream::~ostringstream(local_ac8);
      }
      Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::
      ~Animatable((Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                   *)local_950);
      StringAndIdMap::~StringAndIdMap((StringAndIdMap *)&__range3);
      if (!bVar4) goto LAB_004c887a;
    }
LAB_004c94d0:
    ::std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
            *)&jointIdMap._s_to_i._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
            ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_470);
LAB_004c94e8:
  ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
            ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_50);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool RenderSceneConverter::ConvertSkelAnimation(const RenderSceneConverterEnv &env,
                                            const Path &abs_path,
                                            const SkelAnimation &skelAnim,
                                            Animation *anim_out) {
  // The spec says
  // """
  // An animation source is only valid if its translation, rotation, and scale components are all authored, storing arrays size to the same size as the authored joints array.
  // """
  //
  // SkelAnimation contains
  // - Joint animations(translation, rotation, scale)
  // - BlendShape animations(weights)

  std::vector<value::token> joints;

  if (skelAnim.joints.authored()) {
    if (!EvaluateTypedAttribute(env.stage, skelAnim.joints, "joints", &joints, &_err)) {
      PUSH_ERROR_AND_RETURN(fmt::format("Failed to evaluate `joints` in SkelAnimation Prim : {}", abs_path));
    }

    if (!skelAnim.rotations.authored() ||
        !skelAnim.translations.authored() ||
        !skelAnim.scales.authored()) {

      PUSH_ERROR_AND_RETURN(fmt::format("`translations`, `rotations` and `scales` must be all authored for SkelAnimation Prim {}. authored flags: translations {}, rotations {}, scales {}", abs_path, skelAnim.translations.authored() ? "yes" : "no",
      skelAnim.rotations.authored() ? "yes" : "no",
      skelAnim.scales.authored() ? "yes" : "no"));
    }
  }

  // TODO: inbetweens BlendShape
  std::vector<value::token> blendShapes;
  if (skelAnim.blendShapes.authored()) {
    if (!EvaluateTypedAttribute(env.stage, skelAnim.blendShapes, "blendShapes", &blendShapes, &_err)) {
      PUSH_ERROR_AND_RETURN(fmt::format("Failed to evaluate `blendShapes` in SkelAnimation Prim : {}", abs_path));
    }

    if (!skelAnim.blendShapeWeights.authored()) {
      PUSH_ERROR_AND_RETURN(fmt::format("`blendShapeWeights` must be authored for SkelAnimation Prim {}", abs_path));
    }

  }


  //
  // Reorder values[channels][timeCode][jointId] into values[jointId][channels][timeCode]
  //

  std::map<std::string, std::map<AnimationChannel::ChannelType, AnimationChannel>> channelMap;

  // Joint animations
  if (joints.size()) {
    StringAndIdMap jointIdMap;

    for (const auto &joint : joints) {
      uint64_t id = jointIdMap.size();
      jointIdMap.add(joint.str(), id);
    }

    Animatable<std::vector<value::float3>> translations;
    if (!skelAnim.translations.get_value(&translations)) {
      PUSH_ERROR_AND_RETURN(fmt::format("Failed to get `translations` attribute of SkelAnimation. Maybe ValueBlock or connection? : {}", abs_path));
    }

    Animatable<std::vector<value::quatf>> rotations;
    if (!skelAnim.rotations.get_value(&rotations)) {
      PUSH_ERROR_AND_RETURN(fmt::format("Failed to get `rotations` attribute of SkelAnimation. Maybe ValueBlock or connection? : {}", abs_path));
    }

    Animatable<std::vector<value::half3>> scales;
    if (!skelAnim.scales.get_value(&scales)) {
      PUSH_ERROR_AND_RETURN(fmt::format("Failed to get `scales` attribute of SkelAnimation. Maybe ValueBlock or connection? : {}", abs_path));
    }

    DCOUT("translations: has_timesamples " << translations.has_timesamples());
    DCOUT("translations: has_default " << translations.has_default());
    DCOUT("rotations: has_timesamples " << rotations.has_timesamples());
    DCOUT("rotations: has_default " << rotations.has_default());
    DCOUT("scales: has_timesamples " << scales.has_timesamples());
    DCOUT("scales: has_default " << scales.has_default());

    //
    // timesamples value
    //

    if (translations.has_timesamples()) {
      DCOUT("Convert ttranslations");
      const TypedTimeSamples<std::vector<value::float3>> &ts_txs = translations.get_timesamples();

      if (ts_txs.get_samples().empty()) {
        PUSH_ERROR_AND_RETURN(fmt::format("`translations` timeSamples in SkelAnimation is empty : {}", abs_path));
      }

      for (const auto &sample : ts_txs.get_samples()) {
        if (!sample.blocked) {
          // length check
          if (sample.value.size() != joints.size()) {
            PUSH_ERROR_AND_RETURN(fmt::format("Array length mismatch in SkelAnimation. timeCode {} translations.size {} must be equal to joints.size {} : {}", sample.t, sample.value.size(), joints.size(), abs_path));
          }

          for (size_t j = 0; j < sample.value.size(); j++) {
            AnimationSample<value::float3> s;
            s.t = float(sample.t);
            s.value = sample.value[j];

            std::string jointName = jointIdMap.at(j);
            auto &it = channelMap[jointName][AnimationChannel::ChannelType::Translation];
            if (it.translations.samples.empty()) {
              it.type = AnimationChannel::ChannelType::Translation;
            }
            it.translations.samples.push_back(s);
          }

        }
      }
    }

    if (rotations.has_timesamples()) {
      const TypedTimeSamples<std::vector<value::quatf>> &ts_rots = rotations.get_timesamples();
      DCOUT("Convert rotations");
      for (const auto &sample : ts_rots.get_samples()) {
        if (!sample.blocked) {
          if (sample.value.size() != joints.size()) {
            PUSH_ERROR_AND_RETURN(fmt::format("Array length mismatch in SkelAnimation. timeCode {} rotations.size {} must be equal to joints.size {} : {}", sample.t, sample.value.size(), joints.size(), abs_path));
          }
          for (size_t j = 0; j < sample.value.size(); j++) {
            AnimationSample<value::float4> s;
            s.t = float(sample.t);
            s.value[0] = sample.value[j][0];
            s.value[1] = sample.value[j][1];
            s.value[2] = sample.value[j][2];
            s.value[3] = sample.value[j][3];

            std::string jointName = jointIdMap.at(j);
            auto &it = channelMap[jointName][AnimationChannel::ChannelType::Rotation];
            if (it.rotations.samples.empty()) {
              it.type = AnimationChannel::ChannelType::Rotation;
            }
            it.rotations.samples.push_back(s);
          }

        }
      }
    }

    if (scales.has_timesamples()) {
      const TypedTimeSamples<std::vector<value::half3>> &ts_scales = scales.get_timesamples();
      DCOUT("Convert scales");
      for (const auto &sample : ts_scales.get_samples()) {
        if (!sample.blocked) {
          if (sample.value.size() != joints.size()) {
            PUSH_ERROR_AND_RETURN(fmt::format("Array length mismatch in SkelAnimation. timeCode {} scales.size {} must be equal to joints.size {} : {}", sample.t, sample.value.size(), joints.size(), abs_path));
          }

          for (size_t j = 0; j < sample.value.size(); j++) {
            AnimationSample<value::float3> s;
            s.t = float(sample.t);
            s.value[0] = value::half_to_float(sample.value[j][0]);
            s.value[1] = value::half_to_float(sample.value[j][1]);
            s.value[2] = value::half_to_float(sample.value[j][2]);

            std::string jointName = jointIdMap.at(j);
            auto &it = channelMap[jointName][AnimationChannel::ChannelType::Scale];
            if (it.scales.samples.empty()) {
              it.type = AnimationChannel::ChannelType::Scale;
            }
            it.scales.samples.push_back(s);
          }

        }
      }
    }

    //
    // value at 'default' time.
    //

    // Get value and also do length check for scalar(non timeSampled) animation value.
    if (translations.has_default()) {
      DCOUT("translation at default time");
      std::vector<value::float3> translation;
      if (!translations.get_scalar(&translation)) {
        PUSH_ERROR_AND_RETURN(fmt::format("Failed to get `translations` attribute in SkelAnimation: {}", abs_path));
      }
      if (translation.size() != joints.size()) {
        PUSH_ERROR_AND_RETURN(fmt::format("Array length mismatch in SkelAnimation. translations.default.size {} must be equal to joints.size {} : {}", translation.size(), joints.size(), abs_path));
      }

      for (size_t j = 0; j < joints.size(); j++) {
        std::string jointName = jointIdMap.at(j);
        auto &it = channelMap[jointName][AnimationChannel::ChannelType::Translation];
        it.translations.static_value = translation[j];
      }
    }

    if (rotations.has_default()) {
      DCOUT("rotations at default time");
      std::vector<value::float4> rotation;
      std::vector<value::quatf> _rotation;
      if (!rotations.get_scalar(&_rotation)) {
        PUSH_ERROR_AND_RETURN(fmt::format("Failed to get `rotations` attribute in SkelAnimation: {}", abs_path));
      }
      if (_rotation.size() != joints.size()) {
        PUSH_ERROR_AND_RETURN(fmt::format("Array length mismatch in SkelAnimation. rotations.default.size {} must be equal to joints.size {} : {}", _rotation.size(), joints.size(), abs_path));
      }
      std::transform(_rotation.begin(), _rotation.end(), std::back_inserter(rotation), [](const value::quatf &v) {
        value::float4 ret;
        // pxrUSD's TfQuat also uses xyzw memory order.
        ret[0] = v[0];
        ret[1] = v[1];
        ret[2] = v[2];
        ret[3] = v[3];
        return ret;
      });

      for (size_t j = 0; j < joints.size(); j++) {
        std::string jointName = jointIdMap.at(j);
        auto &it = channelMap[jointName][AnimationChannel::ChannelType::Rotation];
        it.rotations.static_value = rotation[j];
      }
    }

    if (scales.has_default()) {
      DCOUT("scales at default time");
      std::vector<value::float3> scale;
      std::vector<value::half3> _scale;
      if (!scales.get_scalar(&_scale)) {
        PUSH_ERROR_AND_RETURN(fmt::format("Failed to get `scales` attribute in SkelAnimation: {}", abs_path));
      }
      if (_scale.size() != joints.size()) {
        PUSH_ERROR_AND_RETURN(fmt::format("Array length mismatch in SkelAnimation. scale.default.size {} must be equal to joints.size {} : {}", _scale.size(), joints.size(), abs_path));
      }
      // half -> float
      std::transform(_scale.begin(), _scale.end(), std::back_inserter(scale), [](const value::half3 &v) {
        value::float3 ret;
        ret[0] = value::half_to_float(v[0]);
        ret[1] = value::half_to_float(v[1]);
        ret[2] = value::half_to_float(v[2]);
        return ret;
      });
      for (size_t j = 0; j < joints.size(); j++) {
        std::string jointName = jointIdMap.at(j);
        auto &it = channelMap[jointName][AnimationChannel::ChannelType::Scale];
        it.scales.static_value = scale[j];
      }
    }


#if 0 // TODO: remove
    if (!is_translations_timesamples) {
      DCOUT("Reorder translation samples");
      // Create a channel value with single-entry
      // Use USD TimeCode::Default for static sample.
      for (const auto &joint : joints) {
        channelMap[joint.str()][AnimationChannel::ChannelType::Translation].type = AnimationChannel::ChannelType::Translation;

        AnimationSample<value::float3> s;
        s.t = std::numeric_limits<float>::quiet_NaN();
        uint64_t joint_id = jointIdMap.at(joint.str());
        s.value = translation[joint_id];
        channelMap[joint.str()][AnimationChannel::ChannelType::Translation].translations.samples.clear();
        channelMap[joint.str()][AnimationChannel::ChannelType::Translation].translations.samples.push_back(s);
      }
    }

    if (!is_rotations_timesamples) {
      DCOUT("Reorder rotation samples");
      for (const auto &joint : joints) {
        channelMap[joint.str()][AnimationChannel::ChannelType::Rotation].type = AnimationChannel::ChannelType::Rotation;

        AnimationSample<value::float4> s;
        s.t = std::numeric_limits<float>::quiet_NaN();
        uint64_t joint_id = jointIdMap.at(joint.str());
        DCOUT("rot joint_id " << joint_id);
        s.value = rotation[joint_id];
        channelMap[joint.str()][AnimationChannel::ChannelType::Rotation].rotations.samples.clear();
        channelMap[joint.str()][AnimationChannel::ChannelType::Rotation].rotations.samples.push_back(s);
      }
    }

    if (!is_scales_timesamples) {
      DCOUT("Reorder scale samples");
      for (const auto &joint : joints) {
        channelMap[joint.str()][AnimationChannel::ChannelType::Scale].type = AnimationChannel::ChannelType::Scale;

        AnimationSample<value::float3> s;
        s.t = std::numeric_limits<float>::quiet_NaN();
        uint64_t joint_id = jointIdMap.at(joint.str());
        s.value = scale[joint_id];
        channelMap[joint.str()][AnimationChannel::ChannelType::Scale].scales.samples.clear();
        channelMap[joint.str()][AnimationChannel::ChannelType::Scale].scales.samples.push_back(s);
      }
    }
#endif
  }

  // BlendShape animations
  if (blendShapes.size()) {

    std::map<std::string, AnimationSampler<float>> weightsMap;

    // Blender 4.1 may export empty bendShapeWeights. We'll accept it.
    //
    // float[] blendShapeWeights
    if (skelAnim.blendShapeWeights.is_value_empty()) {
      for (const auto &bs : blendShapes) {
        weightsMap[bs.str()].static_value = 1.0f;
      }
    } else {

      Animatable<std::vector<float>> weights;
      if (!skelAnim.blendShapeWeights.get_value(&weights)) {
        PUSH_ERROR_AND_RETURN(fmt::format("Failed to get `blendShapeWeights` attribute of SkelAnimation. Maybe ValueBlock or connection? : {}", abs_path));
      }

      if (weights.has_timesamples()) {

        const TypedTimeSamples<std::vector<float>> &ts_weights = weights.get_timesamples();
        DCOUT("Convert timeSampledd weights");
        for (const auto &sample : ts_weights.get_samples()) {
          if (!sample.blocked) {
            if (sample.value.size() != blendShapes.size()) {
              PUSH_ERROR_AND_RETURN(fmt::format("Array length mismatch in SkelAnimation. timeCode {} blendShapeWeights.size {} must be equal to blendShapes.size {} : {}", sample.t, sample.value.size(), blendShapes.size(), abs_path));
            }

            for (size_t j = 0; j < sample.value.size(); j++) {
              AnimationSample<float> s;
              s.t = float(sample.t);
              s.value = sample.value[j];

              const std::string &targetName = blendShapes[j].str();
              weightsMap[targetName].samples.push_back(s);
            }

          }
        }
      }

      if (weights.has_default()) {
        std::vector<float> ws;
        if (!weights.get_scalar(&ws)) {
          PUSH_ERROR_AND_RETURN(fmt::format("Failed to get default value of `blendShapeWeights` attribute of SkelAnimation is invalid : {}", abs_path));
        }

        if (ws.size() != blendShapes.size()) {
          PUSH_ERROR_AND_RETURN(fmt::format("blendShapeWeights.size {} must be equal to blendShapes.size {} : {}", ws.size(), blendShapes.size(), abs_path));
        }

        for (size_t i = 0; i < blendShapes.size(); i++) {
          weightsMap[blendShapes[i].str()].static_value = ws[i];
        }

      } else {
        PUSH_ERROR_AND_RETURN(fmt::format("Internal error. `blendShapeWeights` attribute of SkelAnimation is invalid : {}", abs_path));
      }

    }

    anim_out->blendshape_weights_map = std::move(weightsMap);
  }

  anim_out->abs_path = abs_path.full_path_name();
  anim_out->prim_name = skelAnim.name;
  anim_out->display_name = skelAnim.metas().displayName.value_or("");

  anim_out->channels_map = std::move(channelMap);

  return true;
}